

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O1

int google::OpenObjectFileContainingPcAndGetStartAddress
              (uint64_t pc,uint64_t *start_address,uint64_t *base_address,char *out_file_name,
              int out_file_name_size)

{
  char *__s;
  int iVar1;
  int fd;
  uint uVar2;
  int *piVar3;
  void *pvVar4;
  ssize_t sVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  bool bVar13;
  FileDescriptor wrapped_mem_fd;
  FileDescriptor wrapped_maps_fd;
  uint64_t end_address;
  uint64_t file_offset;
  Elf64_Ehdr ehdr;
  char buf [1024];
  char *local_518;
  char *local_510;
  FileDescriptor local_500;
  FileDescriptor local_4fc;
  char *local_4f8;
  int local_4ec;
  off_t local_4e8;
  uint64_t *local_4e0;
  long local_4d8;
  ulong local_4d0;
  char *local_4c8;
  uint64_t local_4c0;
  ulong local_4b8;
  uint64_t local_4b0;
  long local_4a8;
  long local_4a0;
  int local_478 [4];
  short local_468;
  long local_458;
  ushort local_440;
  char local_438 [1032];
  
  local_4c0 = pc;
  do {
    iVar1 = open("/proc/self/maps",0);
    local_4fc.fd_ = iVar1;
    if (-1 < iVar1) goto LAB_001248db;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
LAB_001248db:
    do {
      fd = open("/proc/self/mem",0);
      local_500.fd_ = fd;
      if (-1 < fd) goto LAB_0012493c;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    if (fd < 0) {
      iVar1 = -1;
    }
    else {
LAB_0012493c:
      local_4d8 = (long)out_file_name_size;
      pcVar11 = local_438;
      local_4e8 = 0;
      pcVar6 = pcVar11;
      local_4ec = iVar1;
      local_4e0 = base_address;
      local_4d0 = (ulong)(uint)out_file_name_size;
      local_4c8 = out_file_name;
      do {
        pcVar7 = local_438;
        uVar2 = (uint)base_address;
        if (pcVar7 == pcVar11) {
          sVar5 = ReadFromOffset(local_4ec,pcVar7,0x400,local_4e8);
          if (0 < sVar5) {
            local_4e8 = local_4e8 + sVar5;
            pcVar11 = local_438 + sVar5;
            goto LAB_00124a43;
          }
          bVar13 = false;
        }
        else {
          __s = pcVar6 + 1;
          if (pcVar11 < __s) {
            abort();
          }
          pvVar4 = memchr(__s,10,(long)pcVar11 - (long)__s);
          pcVar7 = __s;
          if (pvVar4 == (void *)0x0) {
            local_4f8 = (char *)CONCAT44(local_4f8._4_4_,uVar2);
            iVar1 = (int)((long)pcVar11 - (long)__s);
            pcVar7 = local_438;
            memmove(pcVar7,__s,(long)iVar1);
            uVar2 = (uint)local_4f8;
            sVar5 = ReadFromOffset(local_4ec,local_438 + iVar1,(long)(0x400 - iVar1),local_4e8);
            if (sVar5 < 1) {
              bVar13 = false;
              goto LAB_00124a79;
            }
            local_4e8 = local_4e8 + sVar5;
            pcVar11 = local_438 + iVar1 + sVar5;
          }
LAB_00124a43:
          pcVar6 = (char *)memchr(pcVar7,10,(long)pcVar11 - (long)pcVar7);
          bVar13 = pcVar6 != (char *)0x0;
          if (bVar13) {
            *pcVar6 = '\0';
            local_518 = pcVar6;
            local_510 = pcVar7;
          }
        }
LAB_00124a79:
        if (bVar13) {
          local_510 = GetHex(local_510,local_518,start_address);
          if ((local_510 == local_518) || (*local_510 != '-')) {
            bVar13 = false;
            base_address = (uint64_t *)0xffffffff;
          }
          else {
            pcVar7 = GetHex(local_510 + 1,local_518,&local_4b8);
            local_510 = pcVar7;
            if ((pcVar7 == local_518) || (*pcVar7 != ' ')) {
LAB_00124b2d:
              bVar13 = false;
              uVar2 = 0xffffffff;
            }
            else {
              local_510 = pcVar7 + 1;
              bVar13 = true;
              if (local_510 < local_518) {
                uVar9 = (long)local_518 - (long)pcVar7;
                uVar8 = 1;
                do {
                  if (pcVar7[uVar8] == ' ') {
                    uVar9 = uVar8;
                    local_510 = pcVar7 + uVar8;
                    break;
                  }
                  uVar8 = uVar8 + 1;
                  local_510 = local_518;
                } while (uVar9 != uVar8);
                bVar13 = uVar9 < 5;
              }
              if ((bVar13) || (local_510 == local_518)) goto LAB_00124b2d;
              if (((pcVar7[1] == 'r') &&
                  (local_4f8 = local_510, sVar5 = ReadFromOffset(fd,local_478,0x40,*start_address),
                  local_510 = local_4f8, sVar5 == 0x40)) && (local_478[0] == 0x464c457f)) {
                if (local_468 == 2) {
                  *local_4e0 = 0;
                }
                else if (local_468 == 3) {
                  *local_4e0 = *start_address;
                  lVar12 = local_458;
                  for (uVar9 = (ulong)local_440; local_510 = local_4f8, uVar9 != 0;
                      uVar9 = uVar9 - 1) {
                    sVar5 = ReadFromOffset(fd,&local_4b0,0x38,*start_address + lVar12);
                    if (((sVar5 == 0x38) && ((int)local_4b0 == 1)) && (local_4a8 == 0)) {
                      *local_4e0 = *start_address - local_4a0;
                      local_510 = local_4f8;
                      break;
                    }
                    lVar12 = lVar12 + 0x38;
                  }
                }
              }
              bVar13 = true;
              if (((*start_address <= local_4c0) && (local_4c0 < local_4b8)) &&
                 ((pcVar7[1] == 'r' && (pcVar7[3] == 'x')))) {
                local_510 = GetHex(local_510 + 1,local_518,&local_4b0);
                uVar10 = 0xffffffff;
                uVar2 = uVar10;
                if ((local_510 != local_518) && (*local_510 == ' ')) {
                  pcVar7 = local_510 + 1;
                  local_510 = pcVar7;
                  if (pcVar7 < local_518) {
                    iVar1 = 0;
                    do {
                      if (*pcVar7 == ' ') {
                        iVar1 = iVar1 + 1;
                      }
                      else {
                        local_510 = pcVar7;
                        if (1 < iVar1) break;
                      }
                      pcVar7 = pcVar7 + 1;
                      local_510 = local_518;
                    } while (pcVar7 != local_518);
                  }
                  if (local_510 != local_518) {
                    do {
                      uVar2 = open(local_510,0);
                      if (-1 < (int)uVar2) goto LAB_00124d70;
                      piVar3 = __errno_location();
                      pcVar7 = local_4c8;
                    } while (*piVar3 == 4);
                    strncpy(local_4c8,local_510,local_4d0);
                    pcVar7[local_4d8 + -1] = '\0';
                    uVar2 = uVar10;
                  }
                }
LAB_00124d70:
                bVar13 = false;
              }
            }
            base_address = (uint64_t *)(ulong)uVar2;
          }
        }
        else {
          bVar13 = false;
          base_address = (uint64_t *)0xffffffff;
        }
        iVar1 = (int)base_address;
      } while (bVar13);
    }
    anon_unknown_3::FileDescriptor::~FileDescriptor(&local_500);
  }
  anon_unknown_3::FileDescriptor::~FileDescriptor(&local_4fc);
  return iVar1;
}

Assistant:

static ATTRIBUTE_NOINLINE int
OpenObjectFileContainingPcAndGetStartAddress(uint64_t pc,
                                             uint64_t &start_address,
                                             uint64_t &base_address,
                                             char *out_file_name,
                                             int out_file_name_size) {
  int object_fd;

  int maps_fd;
  NO_INTR(maps_fd = open("/proc/self/maps", O_RDONLY));
  FileDescriptor wrapped_maps_fd(maps_fd);
  if (wrapped_maps_fd.get() < 0) {
    return -1;
  }

  int mem_fd;
  NO_INTR(mem_fd = open("/proc/self/mem", O_RDONLY));
  FileDescriptor wrapped_mem_fd(mem_fd);
  if (wrapped_mem_fd.get() < 0) {
    return -1;
  }

  // Iterate over maps and look for the map containing the pc.  Then
  // look into the symbol tables inside.
  char buf[1024];  // Big enough for line of sane /proc/self/maps
  int num_maps = 0;
  LineReader reader(wrapped_maps_fd.get(), buf, sizeof(buf), 0);
  while (true) {
    num_maps++;
    const char *cursor;
    const char *eol;
    if (!reader.ReadLine(&cursor, &eol)) {  // EOF or malformed line.
      return -1;
    }

    // Start parsing line in /proc/self/maps.  Here is an example:
    //
    // 08048000-0804c000 r-xp 00000000 08:01 2142121    /bin/cat
    //
    // We want start address (08048000), end address (0804c000), flags
    // (r-xp) and file name (/bin/cat).

    // Read start address.
    cursor = GetHex(cursor, eol, &start_address);
    if (cursor == eol || *cursor != '-') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip '-'.

    // Read end address.
    uint64_t end_address;
    cursor = GetHex(cursor, eol, &end_address);
    if (cursor == eol || *cursor != ' ') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Read flags.  Skip flags until we encounter a space or eol.
    const char * const flags_start = cursor;
    while (cursor < eol && *cursor != ' ') {
      ++cursor;
    }
    // We expect at least four letters for flags (ex. "r-xp").
    if (cursor == eol || cursor < flags_start + 4) {
      return -1;  // Malformed line.
    }

    // Determine the base address by reading ELF headers in process memory.
    ElfW(Ehdr) ehdr;
    // Skip non-readable maps.
    if (flags_start[0] == 'r' &&
        ReadFromOffsetExact(mem_fd, &ehdr, sizeof(ElfW(Ehdr)), start_address) &&
        memcmp(ehdr.e_ident, ELFMAG, SELFMAG) == 0) {
      switch (ehdr.e_type) {
        case ET_EXEC:
          base_address = 0;
          break;
        case ET_DYN:
          // Find the segment containing file offset 0. This will correspond
          // to the ELF header that we just read. Normally this will have
          // virtual address 0, but this is not guaranteed. We must subtract
          // the virtual address from the address where the ELF header was
          // mapped to get the base address.
          //
          // If we fail to find a segment for file offset 0, use the address
          // of the ELF header as the base address.
          base_address = start_address;
          for (unsigned i = 0; i != ehdr.e_phnum; ++i) {
            ElfW(Phdr) phdr;
            if (ReadFromOffsetExact(
                    mem_fd, &phdr, sizeof(phdr),
                    start_address + ehdr.e_phoff + i * sizeof(phdr)) &&
                phdr.p_type == PT_LOAD && phdr.p_offset == 0) {
              base_address = start_address - phdr.p_vaddr;
              break;
            }
          }
          break;
        default:
          // ET_REL or ET_CORE. These aren't directly executable, so they don't
          // affect the base address.
          break;
      }
    }

    // Check start and end addresses.
    if (!(start_address <= pc && pc < end_address)) {
      continue;  // We skip this map.  PC isn't in this map.
    }

   // Check flags.  We are only interested in "r*x" maps.
    if (flags_start[0] != 'r' || flags_start[2] != 'x') {
      continue;  // We skip this map.
    }
    ++cursor;  // Skip ' '.

    // Read file offset.
    uint64_t file_offset;
    cursor = GetHex(cursor, eol, &file_offset);
    if (cursor == eol || *cursor != ' ') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Skip to file name.  "cursor" now points to dev.  We need to
    // skip at least two spaces for dev and inode.
    int num_spaces = 0;
    while (cursor < eol) {
      if (*cursor == ' ') {
        ++num_spaces;
      } else if (num_spaces >= 2) {
        // The first non-space character after skipping two spaces
        // is the beginning of the file name.
        break;
      }
      ++cursor;
    }
    if (cursor == eol) {
      return -1;  // Malformed line.
    }

    // Finally, "cursor" now points to file name of our interest.
    NO_INTR(object_fd = open(cursor, O_RDONLY));
    if (object_fd < 0) {
      // Failed to open object file.  Copy the object file name to
      // |out_file_name|.
      strncpy(out_file_name, cursor, out_file_name_size);
      // Making sure |out_file_name| is always null-terminated.
      out_file_name[out_file_name_size - 1] = '\0';
      return -1;
    }
    return object_fd;
  }
}